

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utilities.cpp
# Opt level: O0

string * XPMP2::GetXPSystemPath_abi_cxx11_(void)

{
  int iVar1;
  ulong uVar2;
  char s [512];
  char acStack_208 [520];
  
  if ((GetXPSystemPath[abi:cxx11]()::sysDir_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&GetXPSystemPath[abi:cxx11]()::sysDir_abi_cxx11_), iVar1 != 0)) {
    std::__cxx11::string::string((string *)&GetXPSystemPath[abi:cxx11]()::sysDir_abi_cxx11_);
    __cxa_atexit(std::__cxx11::string::~string,&GetXPSystemPath[abi:cxx11]()::sysDir_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GetXPSystemPath[abi:cxx11]()::sysDir_abi_cxx11_);
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    XPLMGetSystemPath(acStack_208);
    std::__cxx11::string::operator=
              ((string *)&GetXPSystemPath[abi:cxx11]()::sysDir_abi_cxx11_,acStack_208);
  }
  return &GetXPSystemPath[abi:cxx11]()::sysDir_abi_cxx11_;
}

Assistant:

const std::string& GetXPSystemPath ()
{
    // Fetch XP's system dir once
    static std::string sysDir;
    if (sysDir.empty()) {
        char s[512];
        XPLMGetSystemPath(s);
        sysDir = s;
    }
    return sysDir;
}